

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.h
# Opt level: O2

int av1_get_dx(int angle)

{
  if (0x58 < angle - 1U) {
    if (0x58 < angle - 0x5bU) {
      return 1;
    }
    angle = 0xb4 - angle;
  }
  return (int)dr_intra_derivative[(uint)angle];
}

Assistant:

static inline int av1_get_dx(int angle) {
  if (angle > 0 && angle < 90) {
    return dr_intra_derivative[angle];
  } else if (angle > 90 && angle < 180) {
    return dr_intra_derivative[180 - angle];
  } else {
    // In this case, we are not really going to use dx. We may return any value.
    return 1;
  }
}